

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O1

uint __thiscall
Indexing::HashingClauseVariantIndex::computeHashAndCountVariables
          (HashingClauseVariantIndex *this,Literal *l,VarCounts *varCnts,uint hash_begin)

{
  uint uVar1;
  Comparison CVar2;
  size_t i;
  long lVar3;
  ulong uVar4;
  TermList *arg;
  anon_union_8_2_f154dc0f_for_Term_10 *tl1;
  anon_union_8_2_f154dc0f_for_Term_10 *tl2;
  anon_union_8_2_f154dc0f_for_Term_10 *paVar5;
  int local_34;
  Literal *local_30;
  
  uVar1 = Kernel::Term::numVarOccs(&l->super_Term);
  if (uVar1 == 0) {
    local_30 = l;
    lVar3 = 0;
    do {
      hash_begin = (*(byte *)((long)&local_30 + lVar3) ^ hash_begin) * 0x1000193;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
  }
  else {
    uVar1 = (l->super_Term)._functor;
    local_34 = ((uint)(l->super_Term)._args[0]._content >> 2 & 1) + uVar1 * 2;
    lVar3 = 0;
    do {
      hash_begin = (*(byte *)((long)&local_34 + lVar3) ^ hash_begin) * 0x1000193;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    uVar4 = (ulong)(*(uint *)&(l->super_Term).field_0xc & 0xfffffff);
    tl1 = (anon_union_8_2_f154dc0f_for_Term_10 *)((l->super_Term)._args + uVar4);
    if (uVar1 == 0) {
      tl2 = (anon_union_8_2_f154dc0f_for_Term_10 *)((l->super_Term)._args + (uVar4 - 1));
      CVar2 = VariableIgnoringComparator::compare(&tl1->_sort,&tl2->_sort);
      paVar5 = tl2;
      if (CVar2 == LESS) {
        paVar5 = tl1;
        tl1 = tl2;
      }
      uVar1 = computeHashAndCountVariables(this,&tl1->_sort,varCnts,hash_begin);
      uVar1 = computeHashAndCountVariables(this,&paVar5->_sort,varCnts,uVar1);
      return uVar1;
    }
    uVar1 = tl1->_vars;
    while ((uVar1 & 3) != 2) {
      hash_begin = computeHashAndCountVariables(this,&tl1->_sort,varCnts,hash_begin);
      paVar5 = tl1 + -1;
      tl1 = tl1 + -1;
      uVar1 = paVar5->_vars;
    }
  }
  return hash_begin;
}

Assistant:

unsigned HashingClauseVariantIndex::computeHashAndCountVariables(Literal* l, VarCounts& varCnts, unsigned hash_begin) {
  //cout << "Literal " << l->toString() << endl;

  if (l->ground()) {
    // no variables to count
    // just hash the pointer
    return DefaultHash::hash(l, hash_begin);
  }

  //cout << "will hash header " << header << endl;

  unsigned header = l->header();

  // hashes the predicate symbol and the polarity
  unsigned hash = DefaultHash::hash(header, hash_begin);

  if(l->isEquality()) {
    TermList* ll = l->nthArgument(0);
    TermList* lr = l->nthArgument(1);
    if (VariableIgnoringComparator::compare(ll,lr) == LESS) {
      swap(ll,lr);
    }

    hash = computeHashAndCountVariables(ll,varCnts,hash);
    hash = computeHashAndCountVariables(lr,varCnts,hash);
  } else {
    for(TermList* arg=l->args(); arg->isNonEmpty(); arg=arg->next()) {
      hash = computeHashAndCountVariables(arg,varCnts,hash);
    }
  }

  return hash;
}